

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall
ghc::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  path *__lhs;
  const_iterator cVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  path *element;
  int iVar6;
  iterator __begin2;
  const_iterator a;
  undefined1 local_190 [64];
  iterator local_150;
  iterator __end2;
  const_iterator b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  root_name((path *)local_190,this);
  root_name((path *)&a,base);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_190,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a);
  if (!bVar2) {
    bVar2 = has_root_directory(this);
    bVar3 = has_root_directory(base);
    if (bVar2 == bVar3) {
      bVar2 = has_root_directory(this);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&a);
        std::__cxx11::string::~string((string *)local_190);
      }
      else {
        bVar2 = has_root_directory(base);
        std::__cxx11::string::~string((string *)&a);
        std::__cxx11::string::~string((string *)local_190);
        if (bVar2) goto LAB_0014a647;
      }
      begin(&a,this);
      begin(&b,base);
      while (end((iterator *)local_190,this), a._iter._M_current != (char *)local_190._24_8_) {
        end(&__begin2,base);
        if (b._iter._M_current == __begin2._iter._M_current) {
          std::__cxx11::string::~string((string *)&__begin2._current);
          break;
        }
        _Var4 = std::operator==(&a._current._path,&b._current._path);
        std::__cxx11::string::~string((string *)&__begin2._current);
        std::__cxx11::string::~string((string *)(local_190 + 0x20));
        if (!_Var4) goto LAB_0014a77d;
        iterator::operator++(&a);
        iterator::operator++(&b);
      }
      std::__cxx11::string::~string((string *)(local_190 + 0x20));
LAB_0014a77d:
      end((iterator *)local_190,this);
      if (a._iter._M_current == (char *)local_190._24_8_) {
        end(&__begin2,base);
        cVar1 = __begin2._iter;
        std::__cxx11::string::~string((string *)&__begin2._current);
        std::__cxx11::string::~string((string *)(local_190 + 0x20));
        if (b._iter._M_current == cVar1._M_current) {
          path<char[2],ghc::filesystem::path>
                    (__return_storage_ptr__,(char (*) [2])0x17c739,auto_format);
          goto LAB_0014aa6a;
        }
      }
      else {
        std::__cxx11::string::~string((string *)(local_190 + 0x20));
      }
      end(&__begin2,base);
      input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                ((input_iterator_range<ghc::filesystem::path::iterator> *)local_190,&b,&__begin2);
      std::__cxx11::string::~string((string *)&__begin2._current);
      iterator::iterator(&__begin2,(iterator *)local_190);
      iterator::iterator(&__end2,&local_150);
      iVar6 = 0;
      __lhs = &__begin2._current;
      while (__begin2._iter._M_current != __end2._iter._M_current) {
        path<char[2],ghc::filesystem::path>((path *)&local_70,(char (*) [2])0x17c739,auto_format);
        bVar2 = std::operator!=(&__lhs->_path,&local_70);
        if (bVar2) {
          path<char[1],ghc::filesystem::path>((path *)&local_90,(char (*) [1])0x17e102,auto_format);
          bVar2 = std::operator!=(&__lhs->_path,&local_90);
          if (!bVar2) {
            std::__cxx11::string::~string((string *)&local_90);
            goto LAB_0014a90f;
          }
          path<char[3],ghc::filesystem::path>((path *)&local_50,(char (*) [3])"..",auto_format);
          bVar2 = std::operator!=(&__lhs->_path,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          iVar5 = 1;
          if (!bVar2) goto LAB_0014a917;
        }
        else {
LAB_0014a90f:
          std::__cxx11::string::~string((string *)&local_70);
LAB_0014a917:
          path<char[3],ghc::filesystem::path>((path *)&local_70,(char (*) [3])"..",auto_format);
          _Var4 = std::operator==(&__lhs->_path,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          iVar5 = -(uint)_Var4;
        }
        iVar6 = iVar6 + iVar5;
        iterator::operator++(&__begin2);
      }
      std::__cxx11::string::~string((string *)&__end2._current);
      std::__cxx11::string::~string((string *)__lhs);
      input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range
                ((input_iterator_range<ghc::filesystem::path::iterator> *)local_190);
      (__return_storage_ptr__->_path)._M_string_length = 0;
      (__return_storage_ptr__->_path)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_path).field_2;
      (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
      if (-1 < iVar6) {
        while (bVar2 = iVar6 != 0, iVar6 = iVar6 + -1, bVar2) {
          append<char[3]>(__return_storage_ptr__,(char (*) [3])"..");
        }
        end(&__begin2,this);
        input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                  ((input_iterator_range<ghc::filesystem::path::iterator> *)local_190,&a,&__begin2);
        std::__cxx11::string::~string((string *)&__begin2._current);
        iterator::iterator(&__begin2,(iterator *)local_190);
        iterator::iterator(&__end2,&local_150);
        while (__begin2._iter._M_current != __end2._iter._M_current) {
          operator/=(__return_storage_ptr__,&__begin2._current);
          iterator::operator++(&__begin2);
        }
        std::__cxx11::string::~string((string *)&__end2._current);
        std::__cxx11::string::~string((string *)&__begin2._current);
        input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range
                  ((input_iterator_range<ghc::filesystem::path::iterator> *)local_190);
      }
LAB_0014aa6a:
      std::__cxx11::string::~string((string *)&b._current);
      std::__cxx11::string::~string((string *)&a._current);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)local_190);
LAB_0014a647:
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}